

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-status.c
# Opt level: O1

char * labpack_status_string(labpack_status_t status)

{
  if (status < (LABPACK_STATUS_ERROR_DECODER|LABPACK_STATUS_ERROR_OUT_OF_MEMORY)) {
    return &DAT_0010ba60 + *(int *)(&DAT_0010ba60 + (ulong)status * 4);
  }
  return "Unknown status";
}

Assistant:

const char*
labpack_status_string(labpack_status_t status) {
    switch (status) {
        case LABPACK_STATUS_OK: return "No Error";
        case LABPACK_STATUS_ERROR_OUT_OF_MEMORY: return "Out of Memory Error";
        case LABPACK_STATUS_ERROR_NULL_VALUE: return "Null Value Error";
        case LABPACK_STATUS_ERROR_ENCODER: return "Encoder Error";
        case LABPACK_STATUS_ERROR_DECODER: return "Decoder Error";
        default: assert(UNKNOWN_STATUS);
    }
    return UNKNOWN_STATUS;
}